

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O0

void __thiscall QLearning::QLearning(QLearning *this,int *s,int *r,int *a)

{
  ostream *poVar1;
  undefined4 *puVar2;
  int *a_local;
  int *r_local;
  int *s_local;
  QLearning *this_local;
  
  this->_stateSize = *s;
  this->_actionSize = *a + 1;
  this->_range = *r;
  std::vector<float,_std::allocator<float>_>::vector(&this->_actionRange);
  std::
  map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::map(&this->_q_table);
  if ((0 < *s) && (0 < *a)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Constructor call successful");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    QtableLogic(this,this->_range,this->_stateSize,this->_actionSize);
    poVar1 = std::operator<<((ostream *)&std::cout,"Q table generated successfully successful");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this->_init = true;
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xffffffff;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

QLearning::QLearning(const int &s, const int &r, const int &a) : _stateSize(s), _range(r), _actionSize(a + 1)
{
    try
    {
        if (s > 0 && a > 0)
        {
            std::cout << "Constructor call successful" << std::endl;
            QtableLogic(_range, _stateSize, _actionSize);
            std::cout << "Q table generated successfully successful" << std::endl;
            _init = true;
        }
        else
        {
            throw -1;
        }
    }
    catch (...)
    {
        std::cerr << "State or action size is 0" << std::endl;
    }
}